

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeInfo.cpp
# Opt level: O0

bool __thiscall TypeInfo::testInvaild(TypeInfo *this)

{
  bool bVar1;
  long *plVar2;
  XMLCh *pXVar3;
  XMLCh *pXVar4;
  ostream *poVar5;
  char *pcVar6;
  long lVar7;
  wchar16 *pwVar8;
  DOMElement *pDVar9;
  bool local_752;
  bool local_6d2;
  bool local_652;
  bool local_621;
  bool local_609;
  bool local_5a2;
  bool local_522;
  bool local_4a2;
  bool local_422;
  bool local_3a2;
  bool local_371;
  bool local_2e2;
  bool local_222;
  XStr local_200;
  XStr local_1f8;
  byte local_1e9;
  XStr local_1e8;
  XStr local_1e0;
  XStr local_1d8;
  XStr local_1d0;
  byte local_1c1;
  XStr local_1c0;
  XStr local_1b8;
  XStr local_1b0;
  XStr local_1a8;
  byte local_199;
  XStr local_198;
  XStr local_190;
  long *local_188;
  DOMElement *testEle2;
  XStr local_178;
  byte local_169;
  XStr local_168;
  XStr local_160;
  XStr local_158;
  XStr local_150;
  byte local_141;
  XStr local_140;
  XStr local_138;
  XStr local_130;
  XStr local_128;
  byte local_119;
  XStr local_118;
  XStr local_110;
  XStr local_108;
  XStr local_100;
  byte local_f1;
  XStr local_f0;
  XStr local_e8;
  XStr local_e0;
  XStr local_d8;
  byte local_c9;
  XStr local_c8;
  XStr local_c0;
  XStr local_b8;
  XStr local_b0;
  XStr local_a8;
  XStr local_a0;
  byte local_91;
  XStr local_90;
  XStr local_88;
  XStr local_80;
  XStr local_78;
  XStr local_70;
  DOMElement *local_68;
  DOMElement *testEle;
  XStr local_58;
  byte local_49;
  XStr local_48 [3];
  XStr local_30;
  long *local_28;
  DOMAttr *testAttr;
  DOMNode *docEle;
  TypeInfo *pTStack_10;
  bool passed;
  TypeInfo *this_local;
  
  docEle._7_1_ = 1;
  pTStack_10 = this;
  testAttr = (DOMAttr *)(**(code **)(*(long *)this->doc + 0x68))();
  plVar2 = (long *)(**(code **)(*(long *)testAttr + 0x1d8))();
  pXVar3 = (XMLCh *)(**(code **)(*plVar2 + 0x10))();
  XStr::XStr(&local_30,"rootType");
  local_49 = 0;
  pXVar4 = XStr::unicodeForm(&local_30);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar3,pXVar4);
  local_222 = false;
  if (bVar1) {
    plVar2 = (long *)(**(code **)(*(long *)testAttr + 0x1d8))();
    pXVar3 = (XMLCh *)(**(code **)(*plVar2 + 0x18))();
    XStr::XStr(local_48,"");
    local_49 = 1;
    pXVar4 = XStr::unicodeForm(local_48);
    local_222 = xercesc_4_0::XMLString::equals(pXVar3,pXVar4);
  }
  tmp = local_222;
  if ((local_49 & 1) != 0) {
    XStr::~XStr(local_48);
  }
  XStr::~XStr(&local_30);
  if ((tmp & 1U) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2a9);
    poVar5 = std::operator<<(poVar5,"\nExpected values : typename \'");
    XStr::XStr(&local_58,"rootType");
    pXVar3 = XStr::unicodeForm(&local_58);
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,"\', uri \'");
    XStr::XStr((XStr *)&testEle,"");
    pXVar3 = XStr::unicodeForm((XStr *)&testEle);
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar5,pcVar6);
    XStr::~XStr((XStr *)&testEle);
    XStr::~XStr(&local_58);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar2 = (long *)(**(code **)(*(long *)testAttr + 0x1d8))();
    lVar7 = (**(code **)(*plVar2 + 0x10))();
    if (lVar7 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar2 = (long *)(**(code **)(*(long *)testAttr + 0x1d8))();
      pwVar8 = (wchar16 *)(**(code **)(*plVar2 + 0x10))();
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar6);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar2 = (long *)(**(code **)(*(long *)testAttr + 0x1d8))();
    lVar7 = (**(code **)(*plVar2 + 0x18))();
    if (lVar7 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar2 = (long *)(**(code **)(*(long *)testAttr + 0x1d8))();
      pwVar8 = (wchar16 *)(**(code **)(*plVar2 + 0x18))();
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar6);
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    docEle._7_1_ = 0;
  }
  XStr::XStr(&local_70,"invalidTest");
  pXVar3 = XStr::unicodeForm(&local_70);
  pDVar9 = findElement(this,pXVar3);
  XStr::~XStr(&local_70);
  local_68 = pDVar9;
  XStr::XStr(&local_78,"");
  pXVar3 = XStr::unicodeForm(&local_78);
  XStr::XStr(&local_80,"simple");
  pXVar4 = XStr::unicodeForm(&local_80);
  local_28 = (long *)(**(code **)(*(long *)pDVar9 + 0x198))(pDVar9,pXVar3,pXVar4);
  XStr::~XStr(&local_80);
  XStr::~XStr(&local_78);
  plVar2 = (long *)(**(code **)(*local_28 + 0x170))();
  pXVar3 = (XMLCh *)(**(code **)(*plVar2 + 0x10))();
  XStr::XStr(&local_88,"stringDerivedType");
  local_91 = 0;
  pXVar4 = XStr::unicodeForm(&local_88);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar3,pXVar4);
  local_2e2 = false;
  if (bVar1) {
    plVar2 = (long *)(**(code **)(*local_28 + 0x170))();
    pXVar3 = (XMLCh *)(**(code **)(*plVar2 + 0x18))();
    XStr::XStr(&local_90,"");
    local_91 = 1;
    pXVar4 = XStr::unicodeForm(&local_90);
    local_2e2 = xercesc_4_0::XMLString::equals(pXVar3,pXVar4);
  }
  tmp = local_2e2;
  if ((local_91 & 1) != 0) {
    XStr::~XStr(&local_90);
  }
  XStr::~XStr(&local_88);
  if ((tmp & 1U) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2af);
    poVar5 = std::operator<<(poVar5,"\nExpected values : typename \'");
    XStr::XStr(&local_a0,"stringDerivedType");
    pXVar3 = XStr::unicodeForm(&local_a0);
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,"\', uri \'");
    XStr::XStr(&local_a8,"");
    pXVar3 = XStr::unicodeForm(&local_a8);
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar5,pcVar6);
    XStr::~XStr(&local_a8);
    XStr::~XStr(&local_a0);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar2 = (long *)(**(code **)(*local_28 + 0x170))();
    lVar7 = (**(code **)(*plVar2 + 0x10))();
    if (lVar7 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar2 = (long *)(**(code **)(*local_28 + 0x170))();
      pwVar8 = (wchar16 *)(**(code **)(*plVar2 + 0x10))();
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar6);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar2 = (long *)(**(code **)(*local_28 + 0x170))();
    lVar7 = (**(code **)(*plVar2 + 0x18))();
    if (lVar7 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar2 = (long *)(**(code **)(*local_28 + 0x170))();
      pwVar8 = (wchar16 *)(**(code **)(*plVar2 + 0x18))();
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar6);
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    docEle._7_1_ = 0;
  }
  pDVar9 = local_68;
  XStr::XStr(&local_b0,"");
  pXVar3 = XStr::unicodeForm(&local_b0);
  XStr::XStr(&local_b8,"invalid");
  pXVar4 = XStr::unicodeForm(&local_b8);
  local_28 = (long *)(**(code **)(*(long *)pDVar9 + 0x198))(pDVar9,pXVar3,pXVar4);
  XStr::~XStr(&local_b8);
  XStr::~XStr(&local_b0);
  plVar2 = (long *)(**(code **)(*local_28 + 0x170))();
  pXVar3 = (XMLCh *)(**(code **)(*plVar2 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar3,(XMLCh *)0x0);
  local_371 = false;
  if (bVar1) {
    plVar2 = (long *)(**(code **)(*local_28 + 0x170))();
    pXVar3 = (XMLCh *)(**(code **)(*plVar2 + 0x18))();
    local_371 = xercesc_4_0::XMLString::equals(pXVar3,(XMLCh *)0x0);
  }
  tmp = local_371;
  if (local_371 == false) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2b2);
    poVar5 = std::operator<<(poVar5,"\nExpected values : typename \'");
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,"\', uri \'");
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar5,pcVar6);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar2 = (long *)(**(code **)(*local_28 + 0x170))();
    lVar7 = (**(code **)(*plVar2 + 0x10))();
    if (lVar7 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar2 = (long *)(**(code **)(*local_28 + 0x170))();
      pwVar8 = (wchar16 *)(**(code **)(*plVar2 + 0x10))();
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar6);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar2 = (long *)(**(code **)(*local_28 + 0x170))();
    lVar7 = (**(code **)(*plVar2 + 0x18))();
    if (lVar7 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar2 = (long *)(**(code **)(*local_28 + 0x170))();
      pwVar8 = (wchar16 *)(**(code **)(*plVar2 + 0x18))();
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar6);
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    docEle._7_1_ = 0;
  }
  plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x38))();
  local_68 = (DOMElement *)(**(code **)(*plVar2 + 0x50))();
  plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
  pXVar3 = (XMLCh *)(**(code **)(*plVar2 + 0x10))();
  XStr::XStr(&local_c0,"stringDerivedType");
  local_c9 = 0;
  pXVar4 = XStr::unicodeForm(&local_c0);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar3,pXVar4);
  local_3a2 = false;
  if (bVar1) {
    plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
    pXVar3 = (XMLCh *)(**(code **)(*plVar2 + 0x18))();
    XStr::XStr(&local_c8,"");
    local_c9 = 1;
    pXVar4 = XStr::unicodeForm(&local_c8);
    local_3a2 = xercesc_4_0::XMLString::equals(pXVar3,pXVar4);
  }
  tmp = local_3a2;
  if ((local_c9 & 1) != 0) {
    XStr::~XStr(&local_c8);
  }
  XStr::~XStr(&local_c0);
  if ((tmp & 1U) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2b5);
    poVar5 = std::operator<<(poVar5,"\nExpected values : typename \'");
    XStr::XStr(&local_d8,"stringDerivedType");
    pXVar3 = XStr::unicodeForm(&local_d8);
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,"\', uri \'");
    XStr::XStr(&local_e0,"");
    pXVar3 = XStr::unicodeForm(&local_e0);
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar5,pcVar6);
    XStr::~XStr(&local_e0);
    XStr::~XStr(&local_d8);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
    lVar7 = (**(code **)(*plVar2 + 0x10))();
    if (lVar7 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
      pwVar8 = (wchar16 *)(**(code **)(*plVar2 + 0x10))();
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar6);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
    lVar7 = (**(code **)(*plVar2 + 0x18))();
    if (lVar7 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
      pwVar8 = (wchar16 *)(**(code **)(*plVar2 + 0x18))();
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar6);
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    docEle._7_1_ = 0;
  }
  plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x50))();
  local_68 = (DOMElement *)(**(code **)(*plVar2 + 0x50))();
  plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
  pXVar3 = (XMLCh *)(**(code **)(*plVar2 + 0x10))();
  XStr::XStr(&local_e8,"baseComplex");
  local_f1 = 0;
  pXVar4 = XStr::unicodeForm(&local_e8);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar3,pXVar4);
  local_422 = false;
  if (bVar1) {
    plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
    pXVar3 = (XMLCh *)(**(code **)(*plVar2 + 0x18))();
    XStr::XStr(&local_f0,"");
    local_f1 = 1;
    pXVar4 = XStr::unicodeForm(&local_f0);
    local_422 = xercesc_4_0::XMLString::equals(pXVar3,pXVar4);
  }
  tmp = local_422;
  if ((local_f1 & 1) != 0) {
    XStr::~XStr(&local_f0);
  }
  XStr::~XStr(&local_e8);
  if ((tmp & 1U) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2b8);
    poVar5 = std::operator<<(poVar5,"\nExpected values : typename \'");
    XStr::XStr(&local_100,"baseComplex");
    pXVar3 = XStr::unicodeForm(&local_100);
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,"\', uri \'");
    XStr::XStr(&local_108,"");
    pXVar3 = XStr::unicodeForm(&local_108);
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar5,pcVar6);
    XStr::~XStr(&local_108);
    XStr::~XStr(&local_100);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
    lVar7 = (**(code **)(*plVar2 + 0x10))();
    if (lVar7 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
      pwVar8 = (wchar16 *)(**(code **)(*plVar2 + 0x10))();
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar6);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
    lVar7 = (**(code **)(*plVar2 + 0x18))();
    if (lVar7 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
      pwVar8 = (wchar16 *)(**(code **)(*plVar2 + 0x18))();
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar6);
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    docEle._7_1_ = 0;
  }
  plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x50))();
  local_68 = (DOMElement *)(**(code **)(*plVar2 + 0x50))();
  plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
  pXVar3 = (XMLCh *)(**(code **)(*plVar2 + 0x10))();
  XStr::XStr(&local_110,"stringDerivedType");
  local_119 = 0;
  pXVar4 = XStr::unicodeForm(&local_110);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar3,pXVar4);
  local_4a2 = false;
  if (bVar1) {
    plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
    pXVar3 = (XMLCh *)(**(code **)(*plVar2 + 0x18))();
    XStr::XStr(&local_118,"");
    local_119 = 1;
    pXVar4 = XStr::unicodeForm(&local_118);
    local_4a2 = xercesc_4_0::XMLString::equals(pXVar3,pXVar4);
  }
  tmp = local_4a2;
  if ((local_119 & 1) != 0) {
    XStr::~XStr(&local_118);
  }
  XStr::~XStr(&local_110);
  if ((tmp & 1U) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,700);
    poVar5 = std::operator<<(poVar5,"\nExpected values : typename \'");
    XStr::XStr(&local_128,"stringDerivedType");
    pXVar3 = XStr::unicodeForm(&local_128);
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,"\', uri \'");
    XStr::XStr(&local_130,"");
    pXVar3 = XStr::unicodeForm(&local_130);
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar5,pcVar6);
    XStr::~XStr(&local_130);
    XStr::~XStr(&local_128);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
    lVar7 = (**(code **)(*plVar2 + 0x10))();
    if (lVar7 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
      pwVar8 = (wchar16 *)(**(code **)(*plVar2 + 0x10))();
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar6);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
    lVar7 = (**(code **)(*plVar2 + 0x18))();
    if (lVar7 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
      pwVar8 = (wchar16 *)(**(code **)(*plVar2 + 0x18))();
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar6);
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    docEle._7_1_ = 0;
  }
  plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x50))();
  local_68 = (DOMElement *)(**(code **)(*plVar2 + 0x50))();
  plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
  pXVar3 = (XMLCh *)(**(code **)(*plVar2 + 0x10))();
  XStr::XStr(&local_138,"baseComplex");
  local_141 = 0;
  pXVar4 = XStr::unicodeForm(&local_138);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar3,pXVar4);
  local_522 = false;
  if (bVar1) {
    plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
    pXVar3 = (XMLCh *)(**(code **)(*plVar2 + 0x18))();
    XStr::XStr(&local_140,"");
    local_141 = 1;
    pXVar4 = XStr::unicodeForm(&local_140);
    local_522 = xercesc_4_0::XMLString::equals(pXVar3,pXVar4);
  }
  tmp = local_522;
  if ((local_141 & 1) != 0) {
    XStr::~XStr(&local_140);
  }
  XStr::~XStr(&local_138);
  if ((tmp & 1U) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2bf);
    poVar5 = std::operator<<(poVar5,"\nExpected values : typename \'");
    XStr::XStr(&local_150,"baseComplex");
    pXVar3 = XStr::unicodeForm(&local_150);
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,"\', uri \'");
    XStr::XStr(&local_158,"");
    pXVar3 = XStr::unicodeForm(&local_158);
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar5,pcVar6);
    XStr::~XStr(&local_158);
    XStr::~XStr(&local_150);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
    lVar7 = (**(code **)(*plVar2 + 0x10))();
    if (lVar7 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
      pwVar8 = (wchar16 *)(**(code **)(*plVar2 + 0x10))();
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar6);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
    lVar7 = (**(code **)(*plVar2 + 0x18))();
    if (lVar7 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
      pwVar8 = (wchar16 *)(**(code **)(*plVar2 + 0x18))();
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar6);
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    docEle._7_1_ = 0;
  }
  plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x50))();
  local_68 = (DOMElement *)(**(code **)(*plVar2 + 0x50))();
  plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
  pXVar3 = (XMLCh *)(**(code **)(*plVar2 + 0x10))();
  XStr::XStr(&local_160,"uType");
  local_169 = 0;
  pXVar4 = XStr::unicodeForm(&local_160);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar3,pXVar4);
  local_5a2 = false;
  if (bVar1) {
    plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
    pXVar3 = (XMLCh *)(**(code **)(*plVar2 + 0x18))();
    XStr::XStr(&local_168,"");
    local_169 = 1;
    pXVar4 = XStr::unicodeForm(&local_168);
    local_5a2 = xercesc_4_0::XMLString::equals(pXVar3,pXVar4);
  }
  tmp = local_5a2;
  if ((local_169 & 1) != 0) {
    XStr::~XStr(&local_168);
  }
  XStr::~XStr(&local_160);
  if ((tmp & 1U) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2c2);
    poVar5 = std::operator<<(poVar5,"\nExpected values : typename \'");
    XStr::XStr(&local_178,"uType");
    pXVar3 = XStr::unicodeForm(&local_178);
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,"\', uri \'");
    XStr::XStr((XStr *)&testEle2,"");
    pXVar3 = XStr::unicodeForm((XStr *)&testEle2);
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar5,pcVar6);
    XStr::~XStr((XStr *)&testEle2);
    XStr::~XStr(&local_178);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
    lVar7 = (**(code **)(*plVar2 + 0x10))();
    if (lVar7 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
      pwVar8 = (wchar16 *)(**(code **)(*plVar2 + 0x10))();
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar6);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
    lVar7 = (**(code **)(*plVar2 + 0x18))();
    if (lVar7 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
      pwVar8 = (wchar16 *)(**(code **)(*plVar2 + 0x18))();
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar6);
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    docEle._7_1_ = 0;
  }
  plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x50))();
  local_68 = (DOMElement *)(**(code **)(*plVar2 + 0x50))();
  plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
  pXVar3 = (XMLCh *)(**(code **)(*plVar2 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar3,(XMLCh *)0x0);
  local_609 = false;
  if (bVar1) {
    plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
    pXVar3 = (XMLCh *)(**(code **)(*plVar2 + 0x18))();
    local_609 = xercesc_4_0::XMLString::equals(pXVar3,(XMLCh *)0x0);
  }
  tmp = local_609;
  if (local_609 == false) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2c5);
    poVar5 = std::operator<<(poVar5,"\nExpected values : typename \'");
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,"\', uri \'");
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar5,pcVar6);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
    lVar7 = (**(code **)(*plVar2 + 0x10))();
    if (lVar7 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
      pwVar8 = (wchar16 *)(**(code **)(*plVar2 + 0x10))();
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar6);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
    lVar7 = (**(code **)(*plVar2 + 0x18))();
    if (lVar7 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
      pwVar8 = (wchar16 *)(**(code **)(*plVar2 + 0x18))();
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar6);
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    docEle._7_1_ = 0;
  }
  plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x38))();
  local_188 = (long *)(**(code **)(*plVar2 + 0x50))();
  plVar2 = (long *)(**(code **)(*local_188 + 0x1d8))();
  pXVar3 = (XMLCh *)(**(code **)(*plVar2 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar3,(XMLCh *)0x0);
  local_621 = false;
  if (bVar1) {
    plVar2 = (long *)(**(code **)(*local_188 + 0x1d8))();
    pXVar3 = (XMLCh *)(**(code **)(*plVar2 + 0x18))();
    local_621 = xercesc_4_0::XMLString::equals(pXVar3,(XMLCh *)0x0);
  }
  tmp = local_621;
  if (local_621 == false) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2c8);
    poVar5 = std::operator<<(poVar5,"\nExpected values : typename \'");
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,"\', uri \'");
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar5,pcVar6);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar2 = (long *)(**(code **)(*local_188 + 0x1d8))();
    lVar7 = (**(code **)(*plVar2 + 0x10))();
    if (lVar7 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar2 = (long *)(**(code **)(*local_188 + 0x1d8))();
      pwVar8 = (wchar16 *)(**(code **)(*plVar2 + 0x10))();
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar6);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar2 = (long *)(**(code **)(*local_188 + 0x1d8))();
    lVar7 = (**(code **)(*plVar2 + 0x18))();
    if (lVar7 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar2 = (long *)(**(code **)(*local_188 + 0x1d8))();
      pwVar8 = (wchar16 *)(**(code **)(*plVar2 + 0x18))();
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar6);
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    docEle._7_1_ = 0;
  }
  plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x50))();
  local_68 = (DOMElement *)(**(code **)(*plVar2 + 0x50))();
  plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
  pXVar3 = (XMLCh *)(**(code **)(*plVar2 + 0x10))();
  XStr::XStr(&local_190,"attrOnlyType");
  local_199 = 0;
  pXVar4 = XStr::unicodeForm(&local_190);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar3,pXVar4);
  local_652 = false;
  if (bVar1) {
    plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
    pXVar3 = (XMLCh *)(**(code **)(*plVar2 + 0x18))();
    XStr::XStr(&local_198,"");
    local_199 = 1;
    pXVar4 = XStr::unicodeForm(&local_198);
    local_652 = xercesc_4_0::XMLString::equals(pXVar3,pXVar4);
  }
  tmp = local_652;
  if ((local_199 & 1) != 0) {
    XStr::~XStr(&local_198);
  }
  XStr::~XStr(&local_190);
  if ((tmp & 1U) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2cb);
    poVar5 = std::operator<<(poVar5,"\nExpected values : typename \'");
    XStr::XStr(&local_1a8,"attrOnlyType");
    pXVar3 = XStr::unicodeForm(&local_1a8);
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,"\', uri \'");
    XStr::XStr(&local_1b0,"");
    pXVar3 = XStr::unicodeForm(&local_1b0);
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar5,pcVar6);
    XStr::~XStr(&local_1b0);
    XStr::~XStr(&local_1a8);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
    lVar7 = (**(code **)(*plVar2 + 0x10))();
    if (lVar7 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
      pwVar8 = (wchar16 *)(**(code **)(*plVar2 + 0x10))();
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar6);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
    lVar7 = (**(code **)(*plVar2 + 0x18))();
    if (lVar7 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
      pwVar8 = (wchar16 *)(**(code **)(*plVar2 + 0x18))();
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar6);
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    docEle._7_1_ = 0;
  }
  plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x50))();
  local_68 = (DOMElement *)(**(code **)(*plVar2 + 0x50))();
  plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
  pXVar3 = (XMLCh *)(**(code **)(*plVar2 + 0x10))();
  XStr::XStr(&local_1b8,"attrOnlyType");
  local_1c1 = 0;
  pXVar4 = XStr::unicodeForm(&local_1b8);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar3,pXVar4);
  local_6d2 = false;
  if (bVar1) {
    plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
    pXVar3 = (XMLCh *)(**(code **)(*plVar2 + 0x18))();
    XStr::XStr(&local_1c0,"");
    local_1c1 = 1;
    pXVar4 = XStr::unicodeForm(&local_1c0);
    local_6d2 = xercesc_4_0::XMLString::equals(pXVar3,pXVar4);
  }
  tmp = local_6d2;
  if ((local_1c1 & 1) != 0) {
    XStr::~XStr(&local_1c0);
  }
  XStr::~XStr(&local_1b8);
  if ((tmp & 1U) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2ce);
    poVar5 = std::operator<<(poVar5,"\nExpected values : typename \'");
    XStr::XStr(&local_1d0,"attrOnlyType");
    pXVar3 = XStr::unicodeForm(&local_1d0);
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,"\', uri \'");
    XStr::XStr(&local_1d8,"");
    pXVar3 = XStr::unicodeForm(&local_1d8);
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar5,pcVar6);
    XStr::~XStr(&local_1d8);
    XStr::~XStr(&local_1d0);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
    lVar7 = (**(code **)(*plVar2 + 0x10))();
    if (lVar7 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
      pwVar8 = (wchar16 *)(**(code **)(*plVar2 + 0x10))();
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar6);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
    lVar7 = (**(code **)(*plVar2 + 0x18))();
    if (lVar7 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
      pwVar8 = (wchar16 *)(**(code **)(*plVar2 + 0x18))();
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar6);
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    docEle._7_1_ = 0;
  }
  plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x50))();
  local_68 = (DOMElement *)(**(code **)(*plVar2 + 0x50))();
  plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
  pXVar3 = (XMLCh *)(**(code **)(*plVar2 + 0x10))();
  XStr::XStr(&local_1e0,"prohibitedAttrType");
  local_1e9 = 0;
  pXVar4 = XStr::unicodeForm(&local_1e0);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar3,pXVar4);
  local_752 = false;
  if (bVar1) {
    plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
    pXVar3 = (XMLCh *)(**(code **)(*plVar2 + 0x18))();
    XStr::XStr(&local_1e8,"");
    local_1e9 = 1;
    pXVar4 = XStr::unicodeForm(&local_1e8);
    local_752 = xercesc_4_0::XMLString::equals(pXVar3,pXVar4);
  }
  tmp = local_752;
  if ((local_1e9 & 1) != 0) {
    XStr::~XStr(&local_1e8);
  }
  XStr::~XStr(&local_1e0);
  if ((tmp & 1U) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2d1);
    poVar5 = std::operator<<(poVar5,"\nExpected values : typename \'");
    XStr::XStr(&local_1f8,"prohibitedAttrType");
    pXVar3 = XStr::unicodeForm(&local_1f8);
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,"\', uri \'");
    XStr::XStr(&local_200,"");
    pXVar3 = XStr::unicodeForm(&local_200);
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar5,pcVar6);
    XStr::~XStr(&local_200);
    XStr::~XStr(&local_1f8);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
    lVar7 = (**(code **)(*plVar2 + 0x10))();
    if (lVar7 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
      pwVar8 = (wchar16 *)(**(code **)(*plVar2 + 0x10))();
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar6);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
    lVar7 = (**(code **)(*plVar2 + 0x18))();
    if (lVar7 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar2 = (long *)(**(code **)(*(long *)local_68 + 0x1d8))();
      pwVar8 = (wchar16 *)(**(code **)(*plVar2 + 0x18))();
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar6);
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    docEle._7_1_ = 0;
  }
  return (bool)(docEle._7_1_ & 1);
}

Assistant:

bool TypeInfo::testInvaild() {

    bool passed = true;
    DOMNode *docEle = doc->getDocumentElement();
    UNUSED(docEle); // silence warning
    DOMAttr *testAttr;


    DOMTYPEINFOTEST(((DOMElement *)docEle)->getSchemaTypeInfo(), X("rootType"), X(""), __LINE__);

    //element invalidTest
    DOMElement *testEle = findElement(X("invalidTest"));

    testAttr = testEle->getAttributeNodeNS(X(""), X("simple"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("stringDerivedType"), X(""), __LINE__);

    testAttr = testEle->getAttributeNodeNS(X(""), X("invalid"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), 0, 0, __LINE__);

    testEle = (DOMElement *)testEle->getFirstChild()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("stringDerivedType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("baseComplex"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    // this is a "number" of type "base" but it has a xsi:type="stringDerivedType"
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("stringDerivedType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("baseComplex"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("uType"), X(""), __LINE__);
    //an undeclared element does not have anon value. Test this here
    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), 0, 0, __LINE__);

    DOMElement *testEle2 = (DOMElement *)testEle->getFirstChild()->getNextSibling();
    DOMTYPEINFOTEST(testEle2->getSchemaTypeInfo(), 0, 0, __LINE__);
    
    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("attrOnlyType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("attrOnlyType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("prohibitedAttrType"), X(""), __LINE__);

    return passed;
}